

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3EvalTokenCosts(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3Expr *pExpr,Fts3TokenAndCost **ppTC,
                       Fts3Expr ***ppOr,int *pRc)

{
  int iVar1;
  Fts3Phrase *pFVar2;
  Fts3TokenAndCost *pFVar3;
  Fts3MultiSegReader *pFVar4;
  Fts3Table *p;
  Fts3SegReader *pFVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  Fts3Expr ***pnLoad;
  long iBlockid;
  long lVar10;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pnLoad = ppOr;
  while (*pRc == 0) {
    iVar8 = pExpr->eType;
    if (iVar8 == 4) {
      pRoot = pExpr->pLeft;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    else {
      if (iVar8 == 2) break;
      if (iVar8 == 5) {
        if (*pRc == 0) {
          pFVar2 = pExpr->pPhrase;
          lVar9 = 0;
          goto LAB_001cc312;
        }
        break;
      }
    }
    pnLoad = ppOr;
    fts3EvalTokenCosts(pCsr,pRoot,pExpr->pLeft,ppTC,ppOr,pRc);
    if (pExpr->eType == 4) {
      pRoot = pExpr->pRight;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    pExpr = pExpr->pRight;
  }
  goto LAB_001cc443;
  while( true ) {
    pFVar3 = *ppTC;
    *ppTC = pFVar3 + 1;
    pFVar3->pPhrase = pFVar2;
    pFVar3->iToken = (int)lVar9;
    pFVar3->pRoot = pRoot;
    pFVar3->pToken = pFVar2->aToken + lVar9;
    pFVar3->iCol = pFVar2->iColumn;
    pFVar4 = pFVar2->aToken[lVar9].pSegcsr;
    if (pFVar4->nSegment < 1) {
      iVar7 = 0;
      iVar8 = 0;
    }
    else {
      p = (Fts3Table *)(pCsr->base).pVtab;
      iVar1 = p->nPgsz;
      iVar8 = 0;
      lVar10 = 0;
      do {
        pFVar5 = pFVar4->apSegment[lVar10];
        if ((pFVar5->ppNextElem == (Fts3HashElem **)0x0) && (pFVar5->rootOnly == '\0')) {
          iVar7 = 0;
          iBlockid = pFVar5->iStartBlock;
          if (pFVar5->iStartBlock <= pFVar5->iLeafEndBlock) {
            do {
              local_3c = -0x55555556;
              iVar7 = sqlite3Fts3ReadBlock(p,iBlockid,(char **)0x0,&local_3c,(int *)pnLoad);
              if ((iVar7 == 0) && (iVar1 < local_3c + 0x23)) {
                iVar8 = iVar8 + (local_3c + 0x22) / iVar1;
              }
            } while ((iVar7 == 0) &&
                    (bVar6 = iBlockid < pFVar5->iLeafEndBlock, iBlockid = iBlockid + 1, bVar6));
          }
        }
        else {
          iVar7 = 0;
        }
      } while ((iVar7 == 0) && (lVar10 = lVar10 + 1, lVar10 < pFVar4->nSegment));
    }
    pFVar3->nOvfl = iVar8;
    *pRc = iVar7;
    lVar9 = lVar9 + 1;
    if (iVar7 != 0) break;
LAB_001cc312:
    if (pFVar2->nToken <= lVar9) break;
  }
LAB_001cc443:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3EvalTokenCosts(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Root of current AND/NEAR cluster */
  Fts3Expr *pExpr,                /* Expression to consider */
  Fts3TokenAndCost **ppTC,        /* Write new entries to *(*ppTC)++ */
  Fts3Expr ***ppOr,               /* Write new OR root to *(*ppOr)++ */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      Fts3Phrase *pPhrase = pExpr->pPhrase;
      int i;
      for(i=0; *pRc==SQLITE_OK && i<pPhrase->nToken; i++){
        Fts3TokenAndCost *pTC = (*ppTC)++;
        pTC->pPhrase = pPhrase;
        pTC->iToken = i;
        pTC->pRoot = pRoot;
        pTC->pToken = &pPhrase->aToken[i];
        pTC->iCol = pPhrase->iColumn;
        *pRc = sqlite3Fts3MsrOvfl(pCsr, pTC->pToken->pSegcsr, &pTC->nOvfl);
      }
    }else if( pExpr->eType!=FTSQUERY_NOT ){
      assert( pExpr->eType==FTSQUERY_OR
           || pExpr->eType==FTSQUERY_AND
           || pExpr->eType==FTSQUERY_NEAR
      );
      assert( pExpr->pLeft && pExpr->pRight );
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pLeft;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pLeft, ppTC, ppOr, pRc);
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pRight;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pRight, ppTC, ppOr, pRc);
    }
  }
}